

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O3

cse_abstract * __thiscall
factory_item<xray_re::se_smart_terrain>::create(factory_item<xray_re::se_smart_terrain> *this)

{
  cse_alife_space_restrictor *this_00;
  
  this_00 = (cse_alife_space_restrictor *)operator_new(0x140);
  xray_re::cse_alife_space_restrictor::cse_alife_space_restrictor(this_00);
  (this_00->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.
  _vptr_cse_abstract = (_func_int **)&PTR__cse_alife_space_restrictor_0024dd00;
  (this_00->super_cse_shape)._vptr_cse_shape = (_func_int **)&PTR__se_smart_terrain_0024dd68;
  (this_00->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.m_clsid.
  field_0 = (this->super_factory_item_base).m_clsid.field_0;
  return (cse_abstract *)this_00;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}